

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<unsigned_short,_std::allocator<unsigned_short>_> *
clickhouse::SliceVector<unsigned_short>
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vec,size_t begin,size_t len)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
  uVar3 = uVar2 - begin;
  if (begin <= uVar2 && uVar3 != 0) {
    if (uVar3 < len) {
      len = uVar3;
    }
    puVar1 = puVar1 + begin;
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)__return_storage_ptr__,
               puVar1,puVar1 + len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}